

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPSSOR.cpp
# Opt level: O1

double __thiscall chrono::ChSolverPSSOR::Solve(ChSolverPSSOR *this,ChSystemDescriptor *sysd)

{
  double dVar1;
  undefined1 auVar2 [16];
  pointer ppCVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  ChConstraint *pCVar6;
  ChVariables *this_00;
  ChConstraint *pCVar7;
  ChConstraint *pCVar8;
  long lVar9;
  long *plVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  long lVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  double old_lambda_friction [3];
  double gi_values [3];
  double local_150;
  double local_128 [4];
  double local_108;
  undefined8 uStack_100;
  ulong local_f0;
  double local_e8;
  undefined8 uStack_e0;
  long local_d0;
  ulong local_c8;
  long local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  long local_a8;
  long lStack_a0;
  long local_90;
  undefined8 uStack_88;
  double local_78 [3];
  ChVectorRef local_60;
  ChVectorRef local_48;
  
  this->maxviolation = 0.0;
  ppCVar3 = (sysd->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar27 = (ulong)((long)(sysd->vconstraints).
                         super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(sysd->vconstraints).
                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  ppCVar4 = (sysd->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar30 = (int)uVar27;
  if (iVar30 != 0) {
    uVar31 = 0;
    do {
      (*(sysd->vconstraints).
        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar31]->_vptr_ChConstraint[6])();
      uVar31 = uVar31 + 1;
    } while ((uVar27 & 0xffffffff) != uVar31);
  }
  uVar31 = (ulong)((long)ppCVar3 - (long)ppCVar4) >> 3;
  if (iVar30 != 0) {
    ppCVar5 = (sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar25 = 0;
    uVar26 = 0xffffffff;
    iVar29 = 0;
    do {
      pCVar6 = ppCVar5[uVar25];
      if (pCVar6->mode == CONSTRAINT_FRIC) {
        local_78[iVar29] = pCVar6->g_i;
        iVar29 = iVar29 + 1;
        if (iVar29 == 3) {
          dVar46 = (local_78[0] + local_78[1] + local_78[2]) / 3.0;
          ppCVar5[uVar26 - 1]->g_i = dVar46;
          ppCVar5[uVar26]->g_i = dVar46;
          pCVar6->g_i = dVar46;
          iVar29 = 0;
        }
      }
      uVar25 = uVar25 + 1;
      uVar26 = uVar26 + 1;
    } while ((uVar27 & 0xffffffff) != uVar25);
  }
  if ((int)uVar31 != 0) {
    uVar25 = 0;
    do {
      this_00 = (sysd->vvariables).
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar25];
      if (this_00->disabled == false) {
        ChVariables::Get_qb(&local_48,this_00);
        ChVariables::Get_fb(&local_60,
                            (sysd->vvariables).
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar25]);
        local_90 = 0;
        uStack_88 = 0;
        local_a8 = local_60.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_;
        lStack_a0 = local_60.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ._8_8_;
        if ((long)local_60.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ._8_8_ < 0 &&
            local_60.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ != 0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                       );
        }
        (*this_00->_vptr_ChVariables[4])(this_00,&local_48,&local_a8);
        if (local_90 != 0) {
          free(*(void **)(local_90 + -8));
        }
      }
      uVar25 = uVar25 + 1;
    } while ((uVar31 & 0xffffffff) != uVar25);
  }
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
    if (iVar30 != 0) {
      ppCVar5 = (sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar31 = 0;
      do {
        ppCVar5[uVar31]->l_i = 0.0;
        uVar31 = uVar31 + 1;
      } while ((uVar27 & 0xffffffff) != uVar31);
    }
  }
  else if (iVar30 != 0) {
    uVar31 = 0;
    do {
      pCVar6 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar31];
      if (pCVar6->active == true) {
        (*pCVar6->_vptr_ChConstraint[8])(pCVar6->l_i);
      }
      uVar31 = uVar31 + 1;
    } while ((uVar27 & 0xffffffff) != uVar31);
  }
  uVar31 = (ulong)(iVar30 - 1);
  local_d0 = (uVar27 & 0xffffffff) << 3;
  local_c0 = uVar31 + 1;
  local_f0 = 0;
  local_b8 = 0x7fffffffffffffff;
  uStack_b0 = 0x7fffffffffffffff;
  local_c8 = uVar31;
  do {
    if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations <= (int)local_f0)
    break;
    this->maxviolation = 0.0;
    lVar28 = (long)(sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar28 == 0) {
      local_150 = 0.0;
    }
    else {
      lVar28 = lVar28 >> 3;
      iVar30 = 0;
      auVar45 = ZEXT864(0) << 0x40;
      local_150 = 0.0;
      lVar32 = 0;
      do {
        dVar46 = auVar45._0_8_;
        pCVar6 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar32];
        if (pCVar6->active == true) {
          (*pCVar6->_vptr_ChConstraint[7])();
          pCVar6 = (sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar32];
          auVar35._8_8_ = 0;
          auVar35._0_8_ = pCVar6->cfm_i;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = pCVar6->l_i;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = dVar46 + pCVar6->b_i;
          auVar36 = vfmadd132sd_fma(auVar35,auVar47,auVar36);
          auVar35 = auVar36;
          (*pCVar6->_vptr_ChConstraint[0xc])();
          ppCVar5 = (sysd->vconstraints).
                    super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pCVar6 = ppCVar5[lVar32];
          auVar33._8_8_ = 0x8000000000000000;
          auVar33._0_8_ = 0x8000000000000000;
          auVar33 = vxorpd_avx512vl(auVar36,auVar33);
          dVar46 = pCVar6->l_i;
          dVar37 = ((this->super_ChIterativeSolverVI).m_omega / pCVar6->g_i) * auVar33._0_8_ +
                   dVar46;
          if (pCVar6->mode == CONSTRAINT_FRIC) {
            local_128[iVar30] = dVar46;
            pCVar6->l_i = dVar37;
            iVar29 = iVar30 + 1;
            auVar48._8_8_ = 0x7fffffffffffffff;
            auVar48._0_8_ = 0x7fffffffffffffff;
            auVar33 = vandpd_avx(auVar36,auVar48);
            uVar11 = vcmpsd_avx512f(ZEXT816(0),auVar36,1);
            auVar34._8_8_ = auVar33._8_8_;
            auVar34._0_8_ = (ulong)(iVar30 == 0) * (ulong)!(bool)((byte)uVar11 & 1) * auVar33._0_8_;
            iVar30 = iVar29;
            if (iVar29 == 3) {
              (*ppCVar5[lVar32 + -2]->_vptr_ChConstraint[0xb])();
              ppCVar5 = (sysd->vconstraints).
                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pCVar6 = ppCVar5[lVar32 + -2];
              pCVar7 = ppCVar5[lVar32 + -1];
              local_e8 = pCVar6->l_i;
              auVar38._8_8_ = 0;
              auVar38._0_8_ = local_e8;
              local_108 = pCVar7->l_i;
              auVar49._8_8_ = 0;
              auVar49._0_8_ = local_108;
              pCVar8 = ppCVar5[lVar32];
              dVar46 = pCVar8->l_i;
              auVar61._8_8_ = 0;
              auVar61._0_8_ = dVar46;
              dVar37 = (this->super_ChIterativeSolverVI).m_shlambda;
              auVar66._8_8_ = 0;
              auVar66._0_8_ = dVar37;
              if ((dVar37 != 1.0) || (NAN(dVar37))) {
                dVar37 = 1.0 - dVar37;
                auVar71._8_8_ = 0;
                auVar71._0_8_ = dVar37 * local_128[0];
                auVar36 = vfmadd213sd_fma(auVar38,auVar66,auVar71);
                local_e8 = auVar36._0_8_;
                auVar72._8_8_ = 0;
                auVar72._0_8_ = dVar37 * local_128[1];
                auVar36 = vfmadd213sd_fma(auVar49,auVar66,auVar72);
                auVar69._8_8_ = 0;
                auVar69._0_8_ = dVar37 * local_128[2];
                auVar33 = vfmadd213sd_fma(auVar61,auVar66,auVar69);
                pCVar6->l_i = local_e8;
                local_108 = auVar36._0_8_;
                pCVar7->l_i = local_108;
                dVar46 = auVar33._0_8_;
                pCVar8->l_i = dVar46;
              }
              local_e8 = local_e8 - local_128[0];
              local_108 = local_108 - local_128[1];
              uStack_100 = 0;
              dVar46 = dVar46 - local_128[2];
              uStack_e0 = 0;
              (*pCVar6->_vptr_ChConstraint[8])();
              (*(sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar32 + -1]->_vptr_ChConstraint[8])
                        (local_108);
              (*(sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar32]->_vptr_ChConstraint[8])(dVar46);
              iVar30 = 0;
              if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
                auVar23._8_8_ = uStack_b0;
                auVar23._0_8_ = local_b8;
                auVar21._8_8_ = uStack_e0;
                auVar21._0_8_ = local_e8;
                auVar36 = vandpd_avx(auVar23,auVar21);
                auVar50._8_8_ = 0;
                auVar50._0_8_ = local_150;
                auVar33 = vmaxsd_avx(auVar50,auVar36);
                auVar19._8_8_ = uStack_100;
                auVar19._0_8_ = local_108;
                auVar36 = vandpd_avx(auVar23,auVar19);
                auVar33 = vmaxsd_avx(auVar33,auVar36);
                auVar15._8_8_ = 0;
                auVar15._0_8_ = dVar46;
                auVar36 = vandpd_avx(auVar23,auVar15);
                auVar36 = vmaxsd_avx(auVar33,auVar36);
                local_150 = auVar36._0_8_;
              }
            }
          }
          else {
            pCVar6->l_i = dVar37;
            (*pCVar6->_vptr_ChConstraint[0xb])();
            pCVar6 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar32];
            dVar37 = pCVar6->l_i;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = dVar37;
            dVar1 = (this->super_ChIterativeSolverVI).m_shlambda;
            auVar51._8_8_ = 0;
            auVar51._0_8_ = dVar1;
            if ((dVar1 != 1.0) || (NAN(dVar1))) {
              auVar62._8_8_ = 0;
              auVar62._0_8_ = dVar46 * (1.0 - dVar1);
              auVar36 = vfmadd213sd_fma(auVar39,auVar51,auVar62);
              dVar37 = auVar36._0_8_;
              pCVar6->l_i = dVar37;
            }
            auVar52._8_8_ = 0x7fffffffffffffff;
            auVar52._0_8_ = 0x7fffffffffffffff;
            auVar34 = vandpd_avx(auVar52,auVar35);
            (*pCVar6->_vptr_ChConstraint[8])();
            if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
              auVar63._8_8_ = 0x7fffffffffffffff;
              auVar63._0_8_ = 0x7fffffffffffffff;
              auVar16._8_8_ = 0;
              auVar16._0_8_ = dVar37 - dVar46;
              auVar36 = vandpd_avx(auVar63,auVar16);
              auVar53._8_8_ = 0;
              auVar53._0_8_ = local_150;
              auVar36 = vmaxsd_avx(auVar53,auVar36);
              local_150 = auVar36._0_8_;
            }
          }
          auVar54._8_8_ = 0x7fffffffffffffff;
          auVar54._0_8_ = 0x7fffffffffffffff;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = this->maxviolation;
          auVar36 = vandpd_avx(auVar34,auVar54);
          auVar36 = vmaxsd_avx(auVar40,auVar36);
          auVar45 = ZEXT1664(auVar36);
          this->maxviolation = auVar36._0_8_;
        }
        lVar32 = lVar32 + 1;
      } while (lVar28 + (ulong)(lVar28 == 0) != lVar32);
    }
    if ((this->super_ChIterativeSolverVI).record_violation_history != false) {
      ChIterativeSolverVI::AtIterationEnd
                (&this->super_ChIterativeSolverVI,this->maxviolation,local_150,(uint)local_f0);
    }
    lVar28 = local_d0;
    this->maxviolation = 0.0;
    if ((int)local_c8 < 0) {
      local_150 = 0.0;
    }
    else {
      lVar32 = 0;
      auVar45 = ZEXT1664(ZEXT816(0));
      local_150 = 0.0;
      iVar30 = 0;
      do {
        dVar46 = auVar45._0_8_;
        pCVar6 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar31 + lVar32];
        if (pCVar6->active == true) {
          (*pCVar6->_vptr_ChConstraint[7])();
          pCVar6 = (sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar31 + lVar32];
          auVar41._8_8_ = 0;
          auVar41._0_8_ = pCVar6->cfm_i;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = pCVar6->l_i;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = dVar46 + pCVar6->b_i;
          auVar36 = vfmadd132sd_fma(auVar41,auVar55,auVar2);
          auVar33 = auVar36;
          (*pCVar6->_vptr_ChConstraint[0xc])();
          pCVar6 = (sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar31 + lVar32];
          auVar12._8_8_ = 0x8000000000000000;
          auVar12._0_8_ = 0x8000000000000000;
          auVar35 = vxorpd_avx512vl(auVar36,auVar12);
          dVar46 = pCVar6->l_i;
          dVar37 = ((this->super_ChIterativeSolverVI).m_omega / pCVar6->g_i) * auVar35._0_8_ +
                   dVar46;
          if (pCVar6->mode == CONSTRAINT_FRIC) {
            local_128[iVar30] = dVar46;
            pCVar6->l_i = dVar37;
            iVar30 = iVar30 + 1;
            auVar67 = SUB6416(ZEXT864(0),0) << 0x40;
            if (iVar30 == 3) {
              (*pCVar6->_vptr_ChConstraint[0xb])();
              ppCVar5 = (sysd->vconstraints).
                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar9 = *(long *)((long)ppCVar5 + lVar32 * 8 + lVar28);
              plVar10 = *(long **)((long)ppCVar5 + lVar32 * 8 + lVar28 + 8);
              local_e8 = (double)plVar10[2];
              auVar42._8_8_ = 0;
              auVar42._0_8_ = local_e8;
              local_108 = *(double *)(lVar9 + 0x10);
              auVar56._8_8_ = 0;
              auVar56._0_8_ = local_108;
              pCVar6 = ppCVar5[uVar31 + lVar32];
              dVar46 = pCVar6->l_i;
              auVar64._8_8_ = 0;
              auVar64._0_8_ = dVar46;
              dVar37 = (this->super_ChIterativeSolverVI).m_shlambda;
              auVar68._8_8_ = 0;
              auVar68._0_8_ = dVar37;
              if ((dVar37 != 1.0) || (NAN(dVar37))) {
                dVar37 = 1.0 - dVar37;
                auVar73._8_8_ = 0;
                auVar73._0_8_ = dVar37 * local_128[0];
                auVar33 = vfmadd213sd_fma(auVar42,auVar68,auVar73);
                local_e8 = auVar33._0_8_;
                auVar74._8_8_ = 0;
                auVar74._0_8_ = dVar37 * local_128[1];
                auVar33 = vfmadd213sd_fma(auVar56,auVar68,auVar74);
                auVar70._8_8_ = 0;
                auVar70._0_8_ = dVar37 * local_128[2];
                auVar35 = vfmadd213sd_fma(auVar64,auVar68,auVar70);
                plVar10[2] = (long)local_e8;
                local_108 = auVar33._0_8_;
                *(double *)(lVar9 + 0x10) = local_108;
                dVar46 = auVar35._0_8_;
                pCVar6->l_i = dVar46;
              }
              local_e8 = local_e8 - local_128[0];
              local_108 = local_108 - local_128[1];
              uStack_100 = 0;
              dVar46 = dVar46 - local_128[2];
              uStack_e0 = 0;
              (**(code **)(*plVar10 + 0x40))();
              (**(code **)(**(long **)((long)(sysd->vconstraints).
                                             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                      lVar32 * 8 + lVar28) + 0x40))(local_108);
              (*(sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar31 + lVar32]->_vptr_ChConstraint[8])();
              auVar13._8_8_ = 0x7fffffffffffffff;
              auVar13._0_8_ = 0x7fffffffffffffff;
              auVar33 = vandpd_avx512vl(auVar36,auVar13);
              uVar11 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar36,1);
              auVar67._8_8_ = auVar33._8_8_;
              auVar67._0_8_ = (ulong)!(bool)((byte)uVar11 & 1) * auVar33._0_8_;
              iVar30 = 0;
              if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
                auVar24._8_8_ = uStack_b0;
                auVar24._0_8_ = local_b8;
                auVar22._8_8_ = uStack_e0;
                auVar22._0_8_ = local_e8;
                auVar36 = vandpd_avx(auVar24,auVar22);
                auVar57._8_8_ = 0;
                auVar57._0_8_ = local_150;
                auVar33 = vmaxsd_avx(auVar57,auVar36);
                auVar20._8_8_ = uStack_100;
                auVar20._0_8_ = local_108;
                auVar36 = vandpd_avx(auVar24,auVar20);
                auVar33 = vmaxsd_avx(auVar33,auVar36);
                auVar17._8_8_ = 0;
                auVar17._0_8_ = dVar46;
                auVar36 = vandpd_avx(auVar24,auVar17);
                auVar36 = vmaxsd_avx(auVar33,auVar36);
                local_150 = auVar36._0_8_;
              }
            }
          }
          else {
            pCVar6->l_i = dVar37;
            (*pCVar6->_vptr_ChConstraint[0xb])();
            pCVar6 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar31 + lVar32];
            dVar37 = pCVar6->l_i;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = dVar37;
            dVar1 = (this->super_ChIterativeSolverVI).m_shlambda;
            auVar58._8_8_ = 0;
            auVar58._0_8_ = dVar1;
            if ((dVar1 != 1.0) || (NAN(dVar1))) {
              auVar65._8_8_ = 0;
              auVar65._0_8_ = dVar46 * (1.0 - dVar1);
              auVar36 = vfmadd213sd_fma(auVar43,auVar58,auVar65);
              dVar37 = auVar36._0_8_;
              pCVar6->l_i = dVar37;
            }
            auVar59._8_8_ = 0x7fffffffffffffff;
            auVar59._0_8_ = 0x7fffffffffffffff;
            auVar67 = vandpd_avx(auVar59,auVar33);
            (*pCVar6->_vptr_ChConstraint[8])();
            if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
              auVar18._8_8_ = 0;
              auVar18._0_8_ = dVar37 - dVar46;
              auVar14._8_8_ = 0x7fffffffffffffff;
              auVar14._0_8_ = 0x7fffffffffffffff;
              auVar36 = vandpd_avx512vl(auVar18,auVar14);
              auVar60._8_8_ = 0;
              auVar60._0_8_ = local_150;
              auVar36 = vmaxsd_avx(auVar60,auVar36);
              local_150 = auVar36._0_8_;
            }
          }
          auVar44._8_8_ = 0;
          auVar44._0_8_ = this->maxviolation;
          auVar36 = vmaxsd_avx(auVar44,auVar67);
          auVar45 = ZEXT1664(auVar36);
          this->maxviolation = auVar36._0_8_;
        }
        lVar9 = local_c0 + -1 + lVar32;
        lVar32 = lVar32 + -1;
      } while (0 < lVar9);
    }
    iVar30 = (int)local_f0;
    uVar26 = iVar30 + 1;
    if ((this->super_ChIterativeSolverVI).record_violation_history != false) {
      ChIterativeSolverVI::AtIterationEnd
                (&this->super_ChIterativeSolverVI,this->maxviolation,local_150,uVar26);
    }
    dVar46 = (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance;
    if (dVar46 <= this->maxviolation) {
      uVar26 = iVar30 + 2;
    }
    local_f0 = (ulong)uVar26;
  } while (dVar46 <= this->maxviolation);
  return this->maxviolation;
}

Assistant:

double ChSolverPSSOR::Solve(ChSystemDescriptor& sysd) {
    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();
    std::vector<ChVariables*>& mvariables = sysd.GetVariablesList();

    maxviolation = 0;
    double maxdeltalambda = 0.;
    int i_friction_comp = 0;
    double old_lambda_friction[3];
    const unsigned int nConstr = (unsigned int)mconstraints.size();
    const unsigned int nVars = (unsigned int)mvariables.size();

    // 1)  Update auxiliary data in all constraints before starting,
    //     that is: g_i=[Cq_i]*[invM_i]*[Cq_i]' and  [Eq_i]=[invM_i]*[Cq_i]'
    for (unsigned int ic = 0; ic < nConstr; ic++)
        mconstraints[ic]->Update_auxiliary();

    // Average all g_i for the triplet of contact constraints n,u,v.
    int j_friction_comp = 0;
    double gi_values[3];
    for (unsigned int ic = 0; ic < nConstr; ic++) {
        if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
            gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
            j_friction_comp++;
            if (j_friction_comp == 3) {
                double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                mconstraints[ic - 2]->Set_g_i(average_g_i);
                mconstraints[ic - 1]->Set_g_i(average_g_i);
                mconstraints[ic - 0]->Set_g_i(average_g_i);
                j_friction_comp = 0;
            }
        }
    }

    // 2)  Compute, for all items with variables, the initial guess for
    //     still unconstrained system:
    for (unsigned int iv = 0; iv < nVars; iv++)
        if (mvariables[iv]->IsActive())
            mvariables[iv]->Compute_invMb_v(mvariables[iv]->Get_qb(), mvariables[iv]->Get_fb());  // q = [M]'*fb

    // 3)  For all items with variables, add the effect of initial (guessed)
    //     lagrangian reactions of constraints, if a warm start is desired.
    //     Otherwise, if no warm start, simply resets initial lagrangians to zero.
    if (m_warm_start) {
        for (unsigned int ic = 0; ic < nConstr; ic++)
            if (mconstraints[ic]->IsActive())
                mconstraints[ic]->Increment_q(mconstraints[ic]->Get_l_i());
    } else {
        for (unsigned int ic = 0; ic < nConstr; ic++)
            mconstraints[ic]->Set_l_i(0.);
    }

    // 4)  Perform the iteration loops
    for (int iter = 0; iter < m_max_iterations;) {
        //
        // Forward sweep, for symmetric SOR
        //
        maxviolation = 0;
        maxdeltalambda = 0;
        i_friction_comp = 0;
        size_t dummy = mconstraints.size();
        for (size_t ic = 0; ic < dummy; ic++) {
            // skip computations if constraint not active.
            if (mconstraints[ic]->IsActive()) {
                // compute residual  c_i = [Cq_i]*q + b_i + cfm_i*l_i
                double mresidual = mconstraints[ic]->Compute_Cq_q() + mconstraints[ic]->Get_b_i() +
                                   mconstraints[ic]->Get_cfm_i() * mconstraints[ic]->Get_l_i();

                // true constraint violation may be different from 'mresidual' (ex:clamped if unilateral)
                double candidate_violation = fabs(mconstraints[ic]->Violation(mresidual));

                // compute:  delta_lambda = -(omega/g_i) * ([Cq_i]*q + b_i + cfm_i*l_i )
                double deltal = (m_omega / mconstraints[ic]->Get_g_i()) * (-mresidual);

                if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                    candidate_violation = 0;
                    // update:   lambda += delta_lambda;
                    old_lambda_friction[i_friction_comp] = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda_friction[i_friction_comp] + deltal);
                    i_friction_comp++;

                    if (i_friction_comp == 1)
                        candidate_violation = fabs(ChMin(0.0, mresidual));

                    if (i_friction_comp == 3) {
                        mconstraints[ic - 2]->Project();  // the N normal component will take care of N,U,V

                        double new_lambda_0 = mconstraints[ic - 2]->Get_l_i();
                        double new_lambda_1 = mconstraints[ic - 1]->Get_l_i();
                        double new_lambda_2 = mconstraints[ic - 0]->Get_l_i();
                        // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                        if (m_shlambda != 1.0) {
                            new_lambda_0 = m_shlambda * new_lambda_0 + (1.0 - m_shlambda) * old_lambda_friction[0];
                            new_lambda_1 = m_shlambda * new_lambda_1 + (1.0 - m_shlambda) * old_lambda_friction[1];
                            new_lambda_2 = m_shlambda * new_lambda_2 + (1.0 - m_shlambda) * old_lambda_friction[2];
                            mconstraints[ic - 2]->Set_l_i(new_lambda_0);
                            mconstraints[ic - 1]->Set_l_i(new_lambda_1);
                            mconstraints[ic - 0]->Set_l_i(new_lambda_2);
                        }
                        double true_delta_0 = new_lambda_0 - old_lambda_friction[0];
                        double true_delta_1 = new_lambda_1 - old_lambda_friction[1];
                        double true_delta_2 = new_lambda_2 - old_lambda_friction[2];
                        mconstraints[ic - 2]->Increment_q(true_delta_0);
                        mconstraints[ic - 1]->Increment_q(true_delta_1);
                        mconstraints[ic - 0]->Increment_q(true_delta_2);

                        if (this->record_violation_history) {
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_0));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_1));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_2));
                        }
                        i_friction_comp = 0;
                    }
                } else {
                    // update:   lambda += delta_lambda;
                    double old_lambda = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda + deltal);

                    // If new lagrangian multiplier does not satisfy inequalities, project
                    // it into an admissible orthant (or, in general, onto an admissible set)
                    mconstraints[ic]->Project();

                    // After projection, the lambda may have changed a bit..
                    double new_lambda = mconstraints[ic]->Get_l_i();

                    // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                    if (m_shlambda != 1.0) {
                        new_lambda = m_shlambda * new_lambda + (1.0 - m_shlambda) * old_lambda;
                        mconstraints[ic]->Set_l_i(new_lambda);
                    }

                    double true_delta = new_lambda - old_lambda;

                    // For all items with variables, add the effect of incremented
                    // (and projected) lagrangian reactions:
                    mconstraints[ic]->Increment_q(true_delta);

                    if (this->record_violation_history)
                        maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta));
                }

                maxviolation = ChMax(maxviolation, fabs(candidate_violation));

            }  // end IsActive()

        }  // end constraint loop

        // Terminate the loop if violation in constraints has been successfully limited.
        // if (maxviolation < m_tolerance)
        //	break;

        // For recording into violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(maxviolation, maxdeltalambda, iter);

        // Increment iter count (each sweep, either forward or backward, is considered
        // as a complete iteration, to be fair when comparing to the non-symmetric SOR :)
        iter++;

        //
        // Backward sweep, for symmetric SOR
        //
        maxviolation = 0.;
        maxdeltalambda = 0.;
        i_friction_comp = 0;

        for (int ic = (nConstr - 1); ic >= 0; ic--) {
            // skip computations if constraint not active.
            if (mconstraints[ic]->IsActive()) {
                // compute residual  c_i = [Cq_i]*q + b_i + cfm_i*l_i
                double mresidual = mconstraints[ic]->Compute_Cq_q() + mconstraints[ic]->Get_b_i() +
                                   mconstraints[ic]->Get_cfm_i() * mconstraints[ic]->Get_l_i();

                // true constraint violation may be different from 'mresidual' (ex:clamped if unilateral)
                double candidate_violation = fabs(mconstraints[ic]->Violation(mresidual));

                // compute:  delta_lambda = -(omega/g_i) * ([Cq_i]*q + b_i + cfm_i*l_i )
                double deltal = (m_omega / mconstraints[ic]->Get_g_i()) * (-mresidual);

                if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                    candidate_violation = 0;
                    // update:   lambda += delta_lambda;
                    old_lambda_friction[i_friction_comp] = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda_friction[i_friction_comp] + deltal);
                    i_friction_comp++;
                    if (i_friction_comp == 3) {
                        mconstraints[ic]->Project();  // the N normal component will take care of N,U,V

                        double new_lambda_0 = mconstraints[ic + 2]->Get_l_i();
                        double new_lambda_1 = mconstraints[ic + 1]->Get_l_i();
                        double new_lambda_2 = mconstraints[ic + 0]->Get_l_i();
                        // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                        if (m_shlambda != 1.0) {
                            new_lambda_0 = m_shlambda * new_lambda_0 + (1.0 - m_shlambda) * old_lambda_friction[0];
                            new_lambda_1 = m_shlambda * new_lambda_1 + (1.0 - m_shlambda) * old_lambda_friction[1];
                            new_lambda_2 = m_shlambda * new_lambda_2 + (1.0 - m_shlambda) * old_lambda_friction[2];
                            mconstraints[ic + 2]->Set_l_i(new_lambda_0);
                            mconstraints[ic + 1]->Set_l_i(new_lambda_1);
                            mconstraints[ic + 0]->Set_l_i(new_lambda_2);
                        }
                        double true_delta_0 = new_lambda_0 - old_lambda_friction[0];
                        double true_delta_1 = new_lambda_1 - old_lambda_friction[1];
                        double true_delta_2 = new_lambda_2 - old_lambda_friction[2];
                        mconstraints[ic + 2]->Increment_q(true_delta_0);
                        mconstraints[ic + 1]->Increment_q(true_delta_1);
                        mconstraints[ic + 0]->Increment_q(true_delta_2);

                        candidate_violation = fabs(ChMin(0.0, mresidual));

                        if (this->record_violation_history) {
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_0));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_1));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_2));
                        }
                        i_friction_comp = 0;
                    }
                } else {
                    // update:   lambda += delta_lambda;
                    double old_lambda = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda + deltal);

                    // If new lagrangian multiplier does not satisfy inequalities, project
                    // it into an admissible orthant (or, in general, onto an admissible set)
                    mconstraints[ic]->Project();

                    // After projection, the lambda may have changed a bit..
                    double new_lambda = mconstraints[ic]->Get_l_i();

                    // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                    if (m_shlambda != 1.0) {
                        new_lambda = m_shlambda * new_lambda + (1.0 - m_shlambda) * old_lambda;
                        mconstraints[ic]->Set_l_i(new_lambda);
                    }

                    double true_delta = new_lambda - old_lambda;

                    // For all items with variables, add the effect of incremented
                    // (and projected) lagrangian reactions:
                    mconstraints[ic]->Increment_q(true_delta);

                    if (this->record_violation_history)
                        maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta));
                }

                maxviolation = ChMax(maxviolation, fabs(candidate_violation));

            }  // end IsActive()

        }  // end loop on constraints

        // For recording into violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(maxviolation, maxdeltalambda, iter);

        // Terminate the loop if violation in constraints has been successfully limited.
        if (maxviolation < m_tolerance)
            break;

        iter++;
    }

    return maxviolation;
}